

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawSelectedInventory::Draw
          (CommandDrawSelectedInventory *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SBarInfoCoordinate SVar4;
  SBarInfoCoordinate SVar5;
  FTexture *pFVar6;
  AInventory *pAVar7;
  double dVar8;
  double flashAlpha;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawSelectedInventory *this_local;
  
  if ((this->alternateOnEmpty & 1U) != 0) {
    SBarInfoCommandFlowControl::Draw((SBarInfoCommandFlowControl *)this,block,statusBar);
  }
  bVar1 = TObjPtr<AInventory>::operator!=
                    (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel,(AInventory *)0x0);
  if ((bVar1) && ((::level.flags & 2) == 0)) {
    if (((this->artiflash & 1U) == 0) || (artiflashTick == 0)) {
      if (((this->itemflash & 1U) != 0) && ((itemflashFade != 0.0 || (NAN(itemflashFade))))) {
        dVar8 = SBarInfoMainBlock::Alpha(block);
        dVar8 = dVar8 * itemflashFade;
        pFVar6 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset + 2);
        SVar4 = SBarInfoCoordinate::operator-(&(this->super_CommandDrawImage).imgx,4);
        SVar5 = SBarInfoCoordinate::operator+(&(this->super_CommandDrawImage).imgy,2);
        iVar2 = SBarInfoMainBlock::XOffset(block);
        iVar3 = SBarInfoMainBlock::YOffset(block);
        bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
        DSBarInfo::DrawGraphic
                  (statusBar,pFVar6,SVar4,SVar5,iVar2,iVar3,dVar8,bVar1,
                   (bool)((this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.field_0x31
                         & 1),false,(this->super_CommandDrawImage).offset,false,-1,-1,nulclip,false)
        ;
      }
      CommandDrawImage::Draw(&this->super_CommandDrawImage,block,statusBar);
    }
    else {
      pFVar6 = FImageCollection::operator[]
                         (&statusBar->Images,statusBar->invBarOffset + (10 - artiflashTick));
      SVar4 = (this->super_CommandDrawImage).imgx;
      SVar5 = (this->super_CommandDrawImage).imgy;
      iVar2 = SBarInfoMainBlock::XOffset(block);
      iVar3 = SBarInfoMainBlock::YOffset(block);
      dVar8 = SBarInfoMainBlock::Alpha(block);
      bVar1 = SBarInfoMainBlock::FullScreenOffsets(block);
      DSBarInfo::DrawGraphic
                (statusBar,pFVar6,SVar4,SVar5,iVar2,iVar3,dVar8,bVar1,
                 (bool)((this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.field_0x31 &
                       1),false,(this->super_CommandDrawImage).offset,false,-1,-1,nulclip,false);
    }
    if (((this->alwaysShowCounter & 1U) != 0) ||
       (pAVar7 = TObjPtr<AInventory>::operator->
                           (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel),
       pAVar7->Amount != 1)) {
      CommandDrawString::Draw
                (&(this->super_CommandDrawNumber).super_CommandDrawString,block,statusBar);
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			if(alternateOnEmpty)
				SBarInfoCommandFlowControl::Draw(block, statusBar);

			if(statusBar->CPlayer->mo->InvSel != NULL && !(level.flags & LEVEL_NOINVENTORYBAR))
			{
				if(artiflash && artiflashTick)
				{
					statusBar->DrawGraphic(statusBar->Images[ARTIFLASH_OFFSET+(4-artiflashTick)], imgx, imgy, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(),
						translatable, false, offset);
				}
				else
				{
					if(itemflash && itemflashFade != 0)
					{
						double flashAlpha = block->Alpha() * itemflashFade;
						statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgCURSOR], imgx-4, imgy+2, block->XOffset(), block->YOffset(), flashAlpha, block->FullScreenOffsets(),
							translatable, false, offset);
					}
					CommandDrawImage::Draw(block, statusBar);
				}
				if(alwaysShowCounter || statusBar->CPlayer->mo->InvSel->Amount != 1)
					CommandDrawNumber::Draw(block, statusBar);
			}
		}